

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductBase.h
# Opt level: O2

PlainObject * __thiscall Eigen::ProductBase::operator_cast_to_Matrix_(ProductBase *this)

{
  ProductBase *this_00;
  
  this_00 = this + 0x10;
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,
             *(Index *)(*(long *)this + 8),1);
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,4>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>>
  ::evalTo<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              *)this,(Matrix<double,__1,_1,_0,__1,_1> *)this_00);
  return (PlainObject *)this_00;
}

Assistant:

operator const PlainObject& () const
    {
      m_result.resize(m_lhs.rows(), m_rhs.cols());
      derived().evalTo(m_result);
      return m_result;
    }